

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfilters.c
# Opt level: O1

void Curl_conn_cf_discard_chain(Curl_cfilter **pcf,Curl_easy *data)

{
  Curl_cfilter *pCVar1;
  Curl_cfilter *pCVar2;
  
  pCVar2 = *pcf;
  if (pCVar2 != (Curl_cfilter *)0x0) {
    *pcf = (Curl_cfilter *)0x0;
    do {
      pCVar1 = pCVar2->next;
      pCVar2->next = (Curl_cfilter *)0x0;
      (*(code *)pCVar2->cft->destroy)(pCVar2,data);
      (*Curl_cfree)(pCVar2);
      pCVar2 = pCVar1;
    } while (pCVar1 != (Curl_cfilter *)0x0);
  }
  return;
}

Assistant:

void Curl_conn_cf_discard_chain(struct Curl_cfilter **pcf,
                                struct Curl_easy *data)
{
  struct Curl_cfilter *cfn, *cf = *pcf;

  if(cf) {
    *pcf = NULL;
    while(cf) {
      cfn = cf->next;
      /* prevent destroying filter to mess with its sub-chain, since
       * we have the reference now and will call destroy on it.
       */
      cf->next = NULL;
      cf->cft->destroy(cf, data);
      free(cf);
      cf = cfn;
    }
  }
}